

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_functional.h
# Opt level: O3

VarOrConst __thiscall
mp::
BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
::Convert(BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
          *this)

{
  double *pdVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  undefined7 extraout_var;
  undefined8 extraout_RAX_00;
  anon_union_8_2_43b0091d_for_VarOrConst_1 aVar4;
  NodeRange NVar5;
  VarOrConst VVar6;
  undefined8 uVar3;
  
  ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
  ::
  PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>>
            ((ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
              *)this->converter_,&this->constr_,&this->prepro_);
  aVar4 = (anon_union_8_2_43b0091d_for_VarOrConst_1)(this->prepro_).lb_;
  pdVar1 = &(this->prepro_).ub_;
  if ((aVar4.c_ != *pdVar1) || (NAN(aVar4.c_) || NAN(*pdVar1))) {
    aVar4 = (anon_union_8_2_43b0091d_for_VarOrConst_1)(long)(this->prepro_).result_var_;
    uVar3 = extraout_RAX;
    if ((long)aVar4 < 0) {
      bVar2 = MapFind(this);
      uVar3 = CONCAT71(extraout_var,bVar2);
      if (!bVar2) {
        NVar5 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                ::AddVar((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)this->converter_,(this->prepro_).lb_,(this->prepro_).ub_,
                         (this->prepro_).type_);
        (this->prepro_).result_var_ = NVar5.ir_.beg_;
        (this->constr_).super_FunctionalConstraint.result_var_ = NVar5.ir_.beg_;
        AddConstraint(this);
        uVar3 = extraout_RAX_00;
      }
      aVar4._4_4_ = 0;
      aVar4.var_ = (this->prepro_).result_var_;
    }
    uVar3 = CONCAT71((int7)((ulong)uVar3 >> 8),1);
  }
  else {
    uVar3 = 0;
  }
  VVar6.field_1.c_ = aVar4.c_;
  VVar6._0_8_ = uVar3;
  return VVar6;
}

Assistant:

VarOrConst Convert() {
    MP_DISPATCH( PreprocessArguments() );
    if (ResultIsConstant())
      return VarOrConst::MakeConst( lb() );
    if (ResultVarIsKnown())
      return VarOrConst::MakeVar( GetResultVar() );
    if (MapFind())
      return VarOrConst::MakeVar( GetResultVar() );
    MP_DISPATCH( AddResultVariable() );
    MP_DISPATCH( AddConstraint() );
    return VarOrConst::MakeVar( GetResultVar() );
  }